

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckbox.cpp
# Opt level: O2

void __thiscall QCheckBox::checkStateSet(QCheckBox *this)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  CheckState _t1;
  
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  uVar1 = *(uint *)(lVar2 + 0x2b4);
  bVar3 = (byte)uVar1;
  *(byte *)(lVar2 + 0x2b4) = bVar3 & 0xfd;
  _t1 = checkState(this);
  if (_t1 == (uVar1 >> 3 & 7)) {
    return;
  }
  *(byte *)(lVar2 + 0x2b4) = bVar3 & 0xc5 | (char)_t1 * '\b';
  checkStateChanged(this,_t1);
  stateChanged(this,_t1);
  return;
}

Assistant:

void QCheckBox::checkStateSet()
{
    Q_D(QCheckBox);
    d->noChange = false;
    Qt::CheckState state = checkState();
    if (state != d->publishedState) {
        d->publishedState = state;
        emit checkStateChanged(state);
#if QT_DEPRECATED_SINCE(6, 9)
        QT_IGNORE_DEPRECATIONS(
        emit stateChanged(state);
        )
#endif
    }
}